

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

char * upb_MtDataEncoder_PutEnumValue(upb_MtDataEncoder *e,char *ptr,uint32_t val)

{
  upb_MtDataEncoderInternal *puVar1;
  uint local_34;
  uint32_t delta;
  upb_MtDataEncoderInternal *in;
  char *pcStack_20;
  uint32_t val_local;
  char *ptr_local;
  upb_MtDataEncoder *e_local;
  
  puVar1 = upb_MtDataEncoder_GetInternal(e,ptr);
  if (val < (puVar1->state).enum_state.last_written_value) {
    __assert_fail("val >= in->state.enum_state.last_written_value",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/mini_descriptor/internal/encode.c"
                  ,0x129,
                  "char *upb_MtDataEncoder_PutEnumValue(upb_MtDataEncoder *, char *, uint32_t)");
  }
  local_34 = val - (puVar1->state).enum_state.last_written_value;
  pcStack_20 = ptr;
  if ((4 < local_34) && ((puVar1->state).enum_state.present_values_mask != 0)) {
    pcStack_20 = upb_MtDataEncoder_FlushDenseEnumMask(e,ptr);
    if (pcStack_20 == (char *)0x0) {
      return (char *)0x0;
    }
    local_34 = local_34 - 5;
  }
  if (4 < local_34) {
    pcStack_20 = upb_MtDataEncoder_PutBase92Varint(e,pcStack_20,local_34,0x5f,0x7e);
    (puVar1->state).enum_state.last_written_value =
         local_34 + (puVar1->state).enum_state.last_written_value;
    local_34 = 0;
  }
  if ((puVar1->state).enum_state.present_values_mask >> ((byte)local_34 & 0x3f) == 0) {
    (puVar1->state).enum_state.present_values_mask =
         1L << ((byte)local_34 & 0x3f) | (puVar1->state).enum_state.present_values_mask;
    return pcStack_20;
  }
  __assert_fail("(in->state.enum_state.present_values_mask >> delta) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/mini_descriptor/internal/encode.c"
                ,0x13a,"char *upb_MtDataEncoder_PutEnumValue(upb_MtDataEncoder *, char *, uint32_t)"
               );
}

Assistant:

char* upb_MtDataEncoder_PutEnumValue(upb_MtDataEncoder* e, char* ptr,
                                     uint32_t val) {
  // TODO: optimize this encoding.
  upb_MtDataEncoderInternal* in = upb_MtDataEncoder_GetInternal(e, ptr);
  UPB_ASSERT(val >= in->state.enum_state.last_written_value);
  uint32_t delta = val - in->state.enum_state.last_written_value;
  if (delta >= 5 && in->state.enum_state.present_values_mask) {
    ptr = upb_MtDataEncoder_FlushDenseEnumMask(e, ptr);
    if (!ptr) {
      return NULL;
    }
    delta -= 5;
  }

  if (delta >= 5) {
    ptr = upb_MtDataEncoder_PutBase92Varint(
        e, ptr, delta, kUpb_EncodedValue_MinSkip, kUpb_EncodedValue_MaxSkip);
    in->state.enum_state.last_written_value += delta;
    delta = 0;
  }

  UPB_ASSERT((in->state.enum_state.present_values_mask >> delta) == 0);
  in->state.enum_state.present_values_mask |= 1ULL << delta;
  return ptr;
}